

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O3

Clause * __thiscall SAT::_getExpl(SAT *this,Lit p)

{
  Reason RVar1;
  int iVar2;
  undefined4 extraout_var;
  
  RVar1.field_0 =
       (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[(uint)(p.x >> 1)].field_0._a;
  iVar2 = (*engine.propagators.data[(ulong)RVar1.field_0 >> 0x20]->_vptr_Propagator[5])
                    (engine.propagators.data[(ulong)RVar1.field_0 >> 0x20],p.x,
                     (ulong)RVar1.field_0 >> 2 & 0x3fffffff);
  return (Clause *)CONCAT44(extraout_var,iVar2);
}

Assistant:

inline int var(Lit p) { return p.x >> 1; }